

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O0

int arg_parse_list_helper(arg *arg,int *list,int n,char *err_msg)

{
  long lVar1;
  char *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  long rawval;
  int i;
  char *endptr;
  char *ptr;
  int local_3c;
  char *local_38;
  char *local_30;
  char *local_28;
  uint local_1c;
  long local_18;
  long local_10;
  
  local_30 = *(char **)(in_RDI + 0x10);
  local_3c = 0;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RCX != (char *)0x0) {
    *in_RCX = '\0';
  }
  while( true ) {
    if (*local_30 == '\0') {
      return local_3c;
    }
    lVar1 = strtol(local_30,&local_38,10);
    if ((lVar1 < -0x80000000) || (0x7fffffff < lVar1)) break;
    if ((int)local_1c <= local_3c) {
      if (local_28 != (char *)0x0) {
        snprintf(local_28,200,"Option %s: List has more than %d entries\n",
                 *(undefined8 *)(local_10 + 8),(ulong)local_1c);
      }
      return 0;
    }
    if (*local_38 == ',') {
      local_38 = local_38 + 1;
    }
    else if (*local_38 != '\0') {
      if (local_28 != (char *)0x0) {
        snprintf(local_28,200,"Option %s: Bad list separator \'%c\'\n",*(undefined8 *)(local_10 + 8)
                 ,(ulong)(uint)(int)*local_38);
      }
      return 0;
    }
    *(int *)(local_18 + (long)local_3c * 4) = (int)lVar1;
    local_30 = local_38;
    local_3c = local_3c + 1;
  }
  if (local_28 != (char *)0x0) {
    snprintf(local_28,200,"Option %s: Value %ld out of range for signed int\n",
             *(undefined8 *)(local_10 + 8),lVar1);
  }
  return 0;
}

Assistant:

int arg_parse_list_helper(const struct arg *arg, int *list, int n,
                          char *err_msg) {
  const char *ptr = arg->val;
  char *endptr;
  int i = 0;

  if (err_msg) err_msg[0] = '\0';

  while (ptr[0] != '\0') {
    long rawval = strtol(ptr, &endptr, 10);  // NOLINT
    if (rawval < INT_MIN || rawval > INT_MAX) {
      SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                     arg->name, rawval);
      return 0;
    } else if (i >= n) {
      SET_ERR_STRING("Option %s: List has more than %d entries\n", arg->name,
                     n);
      return 0;
    } else if (*endptr == ',') {
      endptr++;
    } else if (*endptr != '\0') {
      SET_ERR_STRING("Option %s: Bad list separator '%c'\n", arg->name,
                     *endptr);
      return 0;
    }
    list[i++] = (int)rawval;
    ptr = endptr;
  }
  return i;
}